

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

char * archive_entry_copy_fflags_text(archive_entry *entry,char *flags)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  byte *pbVar5;
  
  archive_mstring_copy_mbs(&entry->ae_fflags_text,flags);
  do {
    bVar2 = *flags;
    uVar4 = (ulong)bVar2;
    if (bVar2 < 0x20) {
      if (bVar2 != 9) {
        if (bVar2 == 0) {
          pbVar3 = (byte *)0x0;
          goto LAB_0015f803;
        }
LAB_0015f7b5:
        pbVar3 = (byte *)0x0;
        pbVar5 = (byte *)flags;
        do {
          while ((0x2c < (byte)uVar4 || ((0x100100000201U >> (uVar4 & 0x3f) & 1) == 0))) {
            pbVar1 = (byte *)flags + 1;
            flags = (char *)((byte *)flags + 1);
            uVar4 = (ulong)*pbVar1;
          }
          while( true ) {
            uVar4 = (ulong)(byte)*flags;
            if ((0x2c < uVar4) || ((0x100100000200U >> (uVar4 & 0x3f) & 1) == 0)) break;
            flags = (char *)((byte *)flags + 1);
          }
          if (pbVar3 == (byte *)0x0) {
            pbVar3 = pbVar5;
          }
          pbVar5 = (byte *)flags;
        } while (*flags != 0);
LAB_0015f803:
        entry->ae_fflags_set = 0;
        entry->ae_fflags_clear = 0;
        return (char *)pbVar3;
      }
    }
    else if ((bVar2 != 0x20) && (bVar2 != 0x2c)) goto LAB_0015f7b5;
    flags = (char *)((byte *)flags + 1);
  } while( true );
}

Assistant:

const char *
archive_entry_copy_fflags_text(struct archive_entry *entry,
    const char *flags)
{
	archive_mstring_copy_mbs(&entry->ae_fflags_text, flags);
	return (ae_strtofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}